

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O1

QModelIndexList * __thiscall
QAbstractItemView::selectedIndexes(QModelIndexList *__return_storage_ptr__,QAbstractItemView *this)

{
  QModelIndex *pQVar1;
  quintptr qVar2;
  int iVar3;
  char cVar4;
  long lVar5;
  iterator aend;
  iterator iVar6;
  long lVar7;
  QModelIndex *pQVar8;
  const_iterator abegin;
  QModelIndex *pQVar9;
  QModelIndex *pQVar10;
  long in_FS_OFFSET;
  QArrayDataPointer<QModelIndex> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar5 = *(long *)(this + 8);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QModelIndex *)0x0;
  (__return_storage_ptr__->d).size = 0;
  lVar7 = *(long *)(lVar5 + 800);
  if (((lVar7 == 0) || (*(int *)(lVar7 + 4) == 0)) || (*(long *)(lVar5 + 0x328) == 0))
  goto LAB_00541079;
  QItemSelectionModel::selectedIndexes();
  QArrayDataPointer<QModelIndex>::operator=(&__return_storage_ptr__->d,&local_50);
  if (&(local_50.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d)->super_QArrayData,0x18,0x10);
    }
  }
  pQVar10 = (__return_storage_ptr__->d).ptr;
  lVar5 = (__return_storage_ptr__->d).size;
  lVar7 = lVar5 >> 2;
  pQVar8 = pQVar10;
  if (0 < lVar7) {
    lVar7 = lVar7 + 1;
    do {
      cVar4 = (**(code **)(*(long *)this + 0x2c0))(this,pQVar8);
      pQVar9 = pQVar8;
      if (cVar4 != '\0') goto LAB_00541005;
      cVar4 = (**(code **)(*(long *)this + 0x2c0))(this,pQVar8 + 1);
      pQVar9 = pQVar8 + 1;
      if (cVar4 != '\0') goto LAB_00541005;
      cVar4 = (**(code **)(*(long *)this + 0x2c0))(this,pQVar8 + 2);
      pQVar9 = pQVar8 + 2;
      if (cVar4 != '\0') goto LAB_00541005;
      cVar4 = (**(code **)(*(long *)this + 0x2c0))(this,pQVar8 + 3);
      pQVar9 = pQVar8 + 3;
      if (cVar4 != '\0') goto LAB_00541005;
      pQVar8 = pQVar8 + 4;
      lVar7 = lVar7 + -1;
    } while (1 < lVar7);
  }
  pQVar1 = pQVar10 + lVar5;
  lVar5 = ((long)pQVar1 - (long)pQVar8 >> 3) * -0x5555555555555555;
  if (lVar5 == 1) {
LAB_00540ff0:
    cVar4 = (**(code **)(*(long *)this + 0x2c0))(this,pQVar8);
    pQVar9 = pQVar1;
    if (cVar4 != '\0') {
      pQVar9 = pQVar8;
    }
  }
  else if (lVar5 == 2) {
LAB_00540fc5:
    cVar4 = (**(code **)(*(long *)this + 0x2c0))(this,pQVar8);
    pQVar9 = pQVar8;
    if (cVar4 == '\0') {
      pQVar8 = pQVar8 + 1;
      goto LAB_00540ff0;
    }
  }
  else {
    pQVar9 = pQVar1;
    if ((lVar5 == 3) &&
       (cVar4 = (**(code **)(*(long *)this + 0x2c0))(this,pQVar8), pQVar9 = pQVar8, cVar4 == '\0'))
    {
      pQVar8 = pQVar8 + 1;
      goto LAB_00540fc5;
    }
  }
LAB_00541005:
  lVar5 = (long)pQVar9 - (long)pQVar10;
  if ((lVar5 >> 3) * -0x5555555555555555 - (__return_storage_ptr__->d).size != 0) {
    aend = QList<QModelIndex>::end(__return_storage_ptr__);
    iVar6 = QList<QModelIndex>::begin(__return_storage_ptr__);
    abegin.i = iVar6.i + lVar5;
    pQVar10 = lVar5 + iVar6.i;
    while (pQVar8 = pQVar10, pQVar10 = pQVar8 + 1, pQVar10 != aend.i) {
      cVar4 = (**(code **)(*(long *)this + 0x2c0))(this,pQVar10);
      if (cVar4 == '\0') {
        ((abegin.i)->m).ptr = pQVar8[1].m.ptr;
        iVar3 = pQVar10->c;
        qVar2 = pQVar8[1].i;
        (abegin.i)->r = pQVar10->r;
        (abegin.i)->c = iVar3;
        (abegin.i)->i = qVar2;
        abegin.i = abegin.i + 1;
      }
    }
    QList<QModelIndex>::erase(__return_storage_ptr__,abegin,(const_iterator)aend.i);
  }
LAB_00541079:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QModelIndexList QAbstractItemView::selectedIndexes() const
{
    Q_D(const QAbstractItemView);
    QModelIndexList indexes;
    if (d->selectionModel) {
        indexes = d->selectionModel->selectedIndexes();
        auto isHidden = [this](const QModelIndex &idx) {
            return isIndexHidden(idx);
        };
        indexes.removeIf(isHidden);
    }
    return indexes;
}